

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall
GlobOptBlockData::MarkTempLastUse(GlobOptBlockData *this,Instr *instr,RegOpnd *regOpnd)

{
  BVIndex i;
  bool bVar1;
  BOOLEAN BVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  bVar1 = OpCodeAttr::NonTempNumberSources(instr->m_opcode);
  i = (regOpnd->m_sym->super_Sym).m_id;
  if (bVar1) {
    BVSparse<Memory::JitArenaAllocator>::Clear(this->isTempSrc,i);
    return;
  }
  BVar2 = BVSparse<Memory::JitArenaAllocator>::Test(this->isTempSrc,i);
  if (BVar2 != '\0') {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,BackwardPhase,sourceContextId,functionId);
    if ((!bVar1) && (this->globOpt->prePassLoop == (Loop *)0x0)) {
      regOpnd->field_0x18 = regOpnd->field_0x18 | 1;
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MarkTempLastUse(IR::Instr *instr, IR::RegOpnd *regOpnd)
{
    if (OpCodeAttr::NonTempNumberSources(instr->m_opcode))
    {
        // Turn off bit if opcode could cause the src to be aliased.
        this->isTempSrc->Clear(regOpnd->m_sym->m_id);
    }
    else if (this->isTempSrc->Test(regOpnd->m_sym->m_id))
    {
        // We just mark things that are temp in the globopt phase.
        // The backwards phase will turn this off if it is not the last use.
        // The isTempSrc is freed at the end of each block, which is why the backwards phase can't
        // just use it.
        if (!PHASE_OFF(Js::BackwardPhase, this->globOpt->func) && !this->globOpt->IsLoopPrePass())
        {
            regOpnd->m_isTempLastUse = true;
        }
    }
}